

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int rejected_set_error(REJECTED_HANDLE rejected,ERROR_HANDLE error_value)

{
  int iVar1;
  AMQP_VALUE item_value;
  AMQP_VALUE error_amqp_value;
  REJECTED_INSTANCE *rejected_instance;
  int result;
  ERROR_HANDLE error_value_local;
  REJECTED_HANDLE rejected_local;
  
  if (rejected == (REJECTED_HANDLE)0x0) {
    rejected_instance._4_4_ = 0x45d8;
  }
  else {
    item_value = amqpvalue_create_error(error_value);
    if (item_value == (AMQP_VALUE)0x0) {
      rejected_instance._4_4_ = 0x45e0;
    }
    else {
      iVar1 = amqpvalue_set_composite_item(rejected->composite_value,0,item_value);
      if (iVar1 == 0) {
        rejected_instance._4_4_ = 0;
      }
      else {
        rejected_instance._4_4_ = 0x45e6;
      }
      amqpvalue_destroy(item_value);
    }
  }
  return rejected_instance._4_4_;
}

Assistant:

int rejected_set_error(REJECTED_HANDLE rejected, ERROR_HANDLE error_value)
{
    int result;

    if (rejected == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        REJECTED_INSTANCE* rejected_instance = (REJECTED_INSTANCE*)rejected;
        AMQP_VALUE error_amqp_value = amqpvalue_create_error(error_value);
        if (error_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(rejected_instance->composite_value, 0, error_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(error_amqp_value);
        }
    }

    return result;
}